

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Glob.cxx
# Opt level: O3

void __thiscall cmsys::Glob::AddExpression(Glob *this,string *expr)

{
  GlobInternals *pGVar1;
  string local_30;
  
  pGVar1 = this->Internals;
  PatternToRegex(&local_30,expr,true,false);
  std::vector<cmsys::RegularExpression,std::allocator<cmsys::RegularExpression>>::
  emplace_back<std::__cxx11::string>
            ((vector<cmsys::RegularExpression,std::allocator<cmsys::RegularExpression>> *)
             &pGVar1->Expressions,&local_30);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void Glob::AddExpression(const std::string& expr)
{
  this->Internals->Expressions.emplace_back(this->PatternToRegex(expr));
}